

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O2

compile_errcode __thiscall Expression::Generate(Expression *this,string *expression_string)

{
  SymbolName SVar1;
  PcodeType op;
  Term *this_00;
  int iVar2;
  string term_string1;
  string temp;
  string term_string2;
  string local_198;
  string add_identity;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  Pcode pcode;
  
  std::__cxx11::string::string((string *)&add_identity,"0",(allocator *)&pcode);
  std::__cxx11::string::string((string *)&term_string1,(string *)&add_identity);
  term_string2._M_dataplus._M_p = (pointer)&term_string2.field_2;
  term_string2._M_string_length = 0;
  op = ADD;
  term_string2.field_2._M_local_buf[0] = '\0';
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  this_00 = &this->m_term;
  iVar2 = 0;
  do {
    while (SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue), iVar2 != 0) {
      if (iVar2 == 2) {
        Term::Generate(this_00,&term_string2);
        PcodeGenerator::GetNextTemp_abi_cxx11_((string *)&pcode,pcode_generator);
        std::__cxx11::string::operator=((string *)&temp,(string *)&pcode);
        std::__cxx11::string::~string((string *)&pcode);
        std::__cxx11::string::string((string *)&local_138,(string *)&temp);
        std::__cxx11::string::string((string *)&local_198,(string *)&term_string1);
        std::__cxx11::string::string((string *)&local_158,(string *)&term_string2);
        Pcode::Pcode(&pcode,op,&local_138,&local_198,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_138);
        std::vector<Pcode,_std::allocator<Pcode>_>::push_back
                  (&pcode_generator->m_pcode_queue,&pcode);
        std::__cxx11::string::_M_assign((string *)&term_string1);
        Pcode::~Pcode(&pcode);
        iVar2 = 1;
      }
      else {
        if (1 < SVar1 - ADD_SYM) {
          std::__cxx11::string::_M_assign((string *)expression_string);
          std::__cxx11::string::~string((string *)&temp);
          std::__cxx11::string::~string((string *)&term_string2);
          std::__cxx11::string::~string((string *)&term_string1);
          std::__cxx11::string::~string((string *)&add_identity);
          return 0;
        }
        op = (PcodeType)(SVar1 != ADD_SYM);
        iVar2 = 2;
LAB_0014b7bf:
        SymbolQueue::NextSymbol(handle_correct_queue);
      }
    }
    if (SVar1 - ADD_SYM < 2) {
      if (SVar1 == SUB_SYM) {
        op = SUB;
      }
      iVar2 = 0;
      goto LAB_0014b7bf;
    }
    if (op == SUB) {
      Term::Generate(this_00,&term_string2);
      PcodeGenerator::GetNextTemp_abi_cxx11_((string *)&pcode,pcode_generator);
      std::__cxx11::string::operator=((string *)&temp,(string *)&pcode);
      std::__cxx11::string::~string((string *)&pcode);
      std::__cxx11::string::string((string *)&local_d8,(string *)&temp);
      std::__cxx11::string::string((string *)&local_f8,(string *)&term_string1);
      std::__cxx11::string::string((string *)&local_118,(string *)&term_string2);
      Pcode::Pcode(&pcode,SUB,&local_d8,&local_f8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::vector<Pcode,_std::allocator<Pcode>_>::push_back(&pcode_generator->m_pcode_queue,&pcode);
      std::__cxx11::string::_M_assign((string *)&term_string1);
      Pcode::~Pcode(&pcode);
      iVar2 = 1;
      op = SUB;
    }
    else {
      Term::Generate(this_00,&term_string1);
      iVar2 = 1;
    }
  } while( true );
}

Assistant:

compile_errcode Expression::Generate(string& expression_string) {
    int ret = COMPILE_OK;
    int state = 0;
    string add_identity("0");
    string term_string1 = add_identity;
    string term_string2;
    string temp;
    PcodeType pcode_type = ADD;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsAddOperation(name)) {
                    if (name == SUB_SYM) {
                        pcode_type = SUB;
                    }
                    state = 0;
                    break;
                } else {
                    if (pcode_type == SUB) {
                        m_term.Generate(term_string2);
                        temp = pcode_generator->GetNextTemp();
                        Pcode pcode(SUB, temp, term_string1, term_string2);
                        pcode_generator->Insert(pcode);
                        term_string1 = temp;
                    } else {
                        m_term.Generate(term_string1);
                    }
                    state = 1;
                    break;
                }
            }
            case 1: {
                if (IsAddOperation(name)) {
                    if (name == ADD_SYM) {
                        pcode_type = ADD;
                    } else {
                        pcode_type = SUB;
                    }
                    state = 2;
                    break;
                } else {
                    expression_string = term_string1;
                    return COMPILE_OK;
                }
            }
            case 2: {
                m_term.Generate(term_string2);
                temp = pcode_generator->GetNextTemp();
                Pcode pcode(pcode_type, temp, term_string1, term_string2);
                pcode_generator->Insert(pcode);
                term_string1 = temp;
                state = 1;
            }
        }
        if (state != 1) {
            handle_correct_queue->NextSymbol();
        }
    }
}